

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printLine<int,int,int,char[12],char[9]>
               (char *text,int *args,int *args_1,int *args_2,char (*args_3) [12],char (*args_4) [9])

{
  string_view text_00;
  undefined1 auVar1 [16];
  string *__return_storage_ptr__;
  undefined1 local_58 [8];
  string message;
  char (*args_local_4) [9];
  char (*args_local_3) [12];
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  char *text_local;
  
  __return_storage_ptr__ = (string *)local_58;
  message.field_2._8_8_ = args_4;
  tinyformat::format<int,int,int,char[12],char[9]>
            (__return_storage_ptr__,(tinyformat *)text,(char *)args,args_1,args_2,(int *)args_3,
             (char (*) [12])args_4,(char (*) [9])__return_storage_ptr__);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)__return_storage_ptr__);
  text_00._M_str = auVar1._8_8_;
  text_00._M_len = (size_t)text_00._M_str;
  printLine(auVar1._0_8_,text_00);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}